

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

uint rf_gfx_load_texture(void *data,int width,int height,rf_pixel_format format,int mipmap_count)

{
  ulong uVar1;
  rf_source_location source_location;
  rf_source_location source_location_00;
  uint uVar2;
  ulong uVar3;
  rf_pixel_format rVar4;
  ulong uVar5;
  char *pcVar6;
  int width_00;
  int iVar7;
  rf_gfx_pixel_format rVar8;
  uint id;
  int local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  void *local_140;
  undefined8 local_138;
  ulong local_130;
  int swizzle_mask [4];
  
  uVar1 = (ulong)(uint)width;
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
  id = 0;
  if ((format - RF_COMPRESSED_ETC1_RGB < 0xfffffffc) ||
     ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_dxt_supported != false)) {
    if ((format == RF_COMPRESSED_ETC1_RGB) &&
       ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc1_supported == false)) {
      pcVar6 = "ETC1 compressed texture format not supported";
    }
    else {
      rVar4 = format & ~RF_UNCOMPRESSED_GRAYSCALE;
      if ((rVar4 == RF_COMPRESSED_ETC2_RGB) &&
         ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc2_supported == false)) {
        pcVar6 = "ETC2 compressed texture format not supported";
      }
      else if ((rVar4 == RF_COMPRESSED_PVRT_RGB) &&
              ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_pvrt_supported == false)) {
        pcVar6 = "PVRT compressed texture format not supported";
      }
      else if ((rVar4 == RF_COMPRESSED_ASTC_4x4_RGBA) &&
              ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_astc_supported == false)) {
        pcVar6 = "ASTC compressed texture format not supported";
      }
      else {
        (*(rf__ctx->field_0).gfx_ctx.gl.PixelStorei)(0xcf5,1);
        (*(rf__ctx->field_0).gfx_ctx.gl.GenTextures)(1,&id);
        (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,id);
        local_140 = data;
        rf_log_impl(1,0x174517,(char *)data);
        local_144 = format - RF_UNCOMPRESSED_GRAYSCALE;
        uVar3 = 0;
        if (0 < mipmap_count) {
          uVar3 = (ulong)(uint)mipmap_count;
        }
        iVar7 = 0;
        local_150 = width;
        local_14c = height;
        local_148 = mipmap_count;
        local_130 = (ulong)format;
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          rVar4 = (rf_pixel_format)local_130;
          width_00 = (int)uVar1;
          uVar2 = rf_pixel_buffer_size(width_00,height,rVar4);
          rVar8 = rf_gfx_get_internal_texture_formats(rVar4);
          local_138 = rVar8._0_8_;
          source_location.proc_name._0_4_ = 0x174423;
          source_location.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          source_location.proc_name._4_4_ = 0;
          source_location.line_in_file = 0x9e2d;
          local_154 = uVar2;
          rf_log_impl(source_location,RF_LOG_TYPE_DEBUG,
                      "Load mipmap level %i (%i x %i), size: %i, offset: %i",uVar5,
                      uVar1 & 0xffffffff,(ulong)(uint)height,(ulong)uVar2,iVar7);
          if ((rVar8._8_8_ >> 0x20 & 1) != 0) {
            local_158 = iVar7;
            if (local_144 < 10) {
              (*(rf__ctx->field_0).gfx_ctx.gl.TexImage2D)
                        (0xde1,(int)uVar5,(uint)local_138,width_00,height,0,
                         (uint)((ulong)local_138 >> 0x20),rVar8.type,
                         (void *)((long)iVar7 + (long)local_140));
            }
            else {
              (*(rf__ctx->field_0).gfx_ctx.gl.CompressedTexImage2D)
                        (0xde1,(int)uVar5,(uint)local_138,width_00,height,0,local_154,
                         (void *)((long)iVar7 + (long)local_140));
            }
            iVar7 = local_158;
            if ((int)local_130 == 2) {
              swizzle_mask[0] = 0x1903;
              swizzle_mask[1] = 0x1903;
              swizzle_mask[2] = 0x1903;
              swizzle_mask[3] = 0x1904;
              (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteriv)(0xde1,0x8e46,swizzle_mask);
              iVar7 = local_158;
            }
            else if ((int)local_130 == 1) {
              swizzle_mask[0] = 0x1903;
              swizzle_mask[1] = 0x1903;
              swizzle_mask[2] = 0x1903;
              swizzle_mask[3] = 1;
              (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteriv)(0xde1,0x8e46,swizzle_mask);
            }
          }
          uVar1 = (long)((ulong)(uint)(width_00 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2;
          height = height / 2;
          iVar7 = iVar7 + local_154;
          if ((int)uVar1 < 2) {
            uVar1 = 1;
          }
          if (height < 2) {
            height = 1;
          }
        }
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2802,0x2901);
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2803,0x2901);
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2600);
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2600);
        uVar2 = local_148;
        if (1 < (int)local_148) {
          (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2601);
          (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2703);
        }
        (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
        if (id != 0) {
          source_location_00.proc_name._0_4_ = 0x174423;
          source_location_00.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          source_location_00.proc_name._4_4_ = 0;
          source_location_00.line_in_file = 0x9e79;
          rf_log_impl(source_location_00,RF_LOG_TYPE_INFO,
                      "[TEX ID %i] rf_texture created successfully (%ix%i - %i mipmaps)",(ulong)id,
                      (ulong)local_150,(ulong)local_14c,(ulong)uVar2);
          return id;
        }
        pcVar6 = "rf_texture could not be created";
      }
    }
  }
  else {
    pcVar6 = "DXT compressed texture format not supported";
  }
  rf_log_impl(4,(rf_log_type)pcVar6);
  return id;
}

Assistant:

RF_API unsigned int rf_gfx_load_texture(void* data, int width, int height, rf_pixel_format format, int mipmap_count)
{
    rf_gl.BindTexture(GL_TEXTURE_2D, 0); // Free any old binding

    unsigned int id = 0;

    // Check texture format support by OpenGL 1.1 (compressed textures not supported)
    if ((!rf_gfx.extensions.tex_comp_dxt_supported) && ((format == RF_COMPRESSED_DXT1_RGB) || (format == RF_COMPRESSED_DXT1_RGBA) || (format == RF_COMPRESSED_DXT3_RGBA) || (format == RF_COMPRESSED_DXT5_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "DXT compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_etc1_supported) && (format == RF_COMPRESSED_ETC1_RGB))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ETC1 compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_etc2_supported) && ((format == RF_COMPRESSED_ETC2_RGB) || (format == RF_COMPRESSED_ETC2_EAC_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ETC2 compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_pvrt_supported) && ((format == RF_COMPRESSED_PVRT_RGB) || (format == RF_COMPRESSED_PVRT_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "PVRT compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_astc_supported) && ((format == RF_COMPRESSED_ASTC_4x4_RGBA) || (format == RF_COMPRESSED_ASTC_8x8_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ASTC compressed texture format not supported");
        return id;
    }

    rf_gl.PixelStorei(GL_UNPACK_ALIGNMENT, 1);

    rf_gl.GenTextures(1, &id);              // Generate texture id

    //rf_gl.ActiveTexture(GL_TEXTURE0);     // If not defined, using GL_TEXTURE0 by default (shader texture)

    rf_gl.BindTexture(GL_TEXTURE_2D, id);

    int mip_width = width;
    int mip_height = height;
    int mip_offset = 0;          // Mipmap data offset

    RF_LOG(RF_LOG_TYPE_DEBUG, "Load texture from data memory address: 0x%x", data);

    // Load the different mipmap levels
    for (rf_int i = 0; i < mipmap_count; i++)
    {
        int mip_size = rf_pixel_buffer_size(mip_width, mip_height, format);

        rf_gfx_pixel_format glformat = rf_gfx_get_internal_texture_formats(format);

        RF_LOG(RF_LOG_TYPE_DEBUG, "Load mipmap level %i (%i x %i), size: %i, offset: %i", i, mip_width, mip_height, mip_size, mip_offset);

        if (glformat.valid)
        {
            if (rf_is_uncompressed_format(format))
            {
                rf_gl.TexImage2D(GL_TEXTURE_2D, i, glformat.internal_format, mip_width, mip_height, 0, glformat.format, glformat.type, (unsigned char* )data + mip_offset);
            }
            else
            {
                rf_gl.CompressedTexImage2D(GL_TEXTURE_2D, i, glformat.internal_format, mip_width, mip_height, 0, mip_size, (unsigned char *)data + mip_offset);
            }

            #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
                if (format == RF_UNCOMPRESSED_GRAYSCALE)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                    rf_gl.TexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
                else if (format == RF_UNCOMPRESSED_GRAY_ALPHA)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
                    rf_gl.TexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
            #endif
        }

        mip_width /= 2;
        mip_height /= 2;
        mip_offset += mip_size;

        // Security check for NPOT textures
        if (mip_width < 1) mip_width = 1;
        if (mip_height < 1) mip_height = 1;
    }

    // rf_texture parameters configuration
    // NOTE: rf_gl.TexParameteri does NOT affect texture uploading, just the way it's used
    #if defined(RAYFORK_GRAPHICS_BACKEND_GL_ES3)
        // NOTE: OpenGL ES 2.0 with no GL_OES_texture_npot support (i.e. WebGL) has limited NPOT support, so CLAMP_TO_EDGE must be used
        if (rf_gfx.extensions.tex_npot_supported)
        {
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
        }
        else
        {
            // NOTE: If using negative texture coordinates (LoadOBJ()), it does not work!
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);       // Set texture to clamp on x-axis
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);       // Set texture to clamp on y-axis
        }
    #else
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
    #endif

    // Magnification and minification filters
    rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR
    rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR

    #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
    if (mipmap_count > 1)
    {
        // Activate Trilinear filtering if mipmaps are available
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    }
    #endif

    // At this point we have the texture loaded in GPU and texture parameters configured

    // NOTE: If mipmaps were not in data, they are not generated automatically

    // Unbind current texture
    rf_gl.BindTexture(GL_TEXTURE_2D, 0);

    if (id > 0) RF_LOG(RF_LOG_TYPE_INFO, "[TEX ID %i] rf_texture created successfully (%ix%i - %i mipmaps)", id, width, height, mipmap_count);
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_texture could not be created");

    return id;
}